

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O2

void __thiscall
kj::_::BTreeImpl::rotateRight
          (BTreeImpl *this,Parent *left,Parent *right,Parent *parent,uint indexInParent)

{
  uint uVar1;
  
  right->keys[3].i = right->keys[2].i;
  *(undefined8 *)(right->keys + 1) = *(undefined8 *)right->keys;
  *(undefined8 *)(right->children + 1) = *(undefined8 *)right->children;
  *(undefined8 *)(right->children + 3) = *(undefined8 *)(right->children + 2);
  uVar1 = Parent::keyCount(left);
  right->keys[0].i = parent->keys[indexInParent].i;
  parent->keys[indexInParent].i = left->keys[uVar1 - 1].i;
  right->children[0] = left->children[uVar1];
  left->keys[uVar1 - 1].i = 0;
  left->children[uVar1] = 0;
  return;
}

Assistant:

void BTreeImpl::rotateRight(Parent& left, Parent& right, Parent& parent, uint indexInParent) {
  // Steal one item from the left node and move it to the right node.

  // Like merge(), this is only called on an exactly-half-empty node.
  KJ_DASSERT(right.isHalfFull());
  KJ_DASSERT(left.isMostlyFull());

  constexpr size_t mid = Parent::NKEYS/2;
  amove(right.keys + 1, right.keys, mid);
  amove(right.children + 1, right.children, mid + 1);

  uint back = left.keyCount() - 1;

  right.keys[0] = parent.keys[indexInParent];
  parent.keys[indexInParent] = left.keys[back];
  right.children[0] = left.children[back + 1];
  left.keys[back] = nullptr;
  left.children[back + 1] = 0;
}